

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipPartials
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,double *inPartials)

{
  int iVar1;
  int iVar2;
  int k;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  int i;
  int iVar6;
  double *__src;
  int l;
  int iVar7;
  bool bVar8;
  
  iVar7 = -5;
  if ((-1 < tipIndex) && (iVar7 = -5, tipIndex < this->kTipCount)) {
    pdVar4 = this->gPartials[(uint)tipIndex];
    if (pdVar4 == (double *)0x0) {
      pdVar4 = (double *)mallocAligned(this,(long)this->kPartialsSize << 3);
      this->gPartials[(uint)tipIndex] = pdVar4;
      pdVar4 = this->gPartials[(uint)tipIndex];
      if (pdVar4 == (double *)0x0) {
        return -2;
      }
    }
    for (iVar7 = 0; iVar7 < this->kCategoryCount; iVar7 = iVar7 + 1) {
      __src = inPartials;
      for (iVar6 = 0; iVar6 < this->kPatternCount; iVar6 = iVar6 + 1) {
        memcpy(pdVar4,__src,(ulong)(uint)this->kStateCount << 3);
        iVar1 = this->kStateCount;
        iVar2 = this->kPartialsPaddedStateCount;
        pdVar4 = pdVar4 + iVar1;
        for (iVar3 = iVar1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          *pdVar4 = 0.0;
          pdVar4 = pdVar4 + 1;
        }
        __src = __src + iVar1;
      }
      uVar5 = (this->kPaddedPatternCount - this->kPatternCount) * this->kPartialsPaddedStateCount;
      uVar5 = ~((int)uVar5 >> 0x1f) & uVar5;
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        *pdVar4 = 0.0;
        pdVar4 = pdVar4 + 1;
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}